

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cpp
# Opt level: O0

uint32_t crc32c_append_sw(uint32_t crci,buffer input,size_t length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t high2;
  uint32_t high;
  uint32_t crc;
  buffer next;
  size_t length_local;
  buffer input_local;
  uint32_t crci_local;
  
  high2 = crci ^ 0xffffffff;
  _high = (uint *)input;
  for (next = (buffer)length; next != (buffer)0x0 && ((ulong)_high & 3) != 0; next = next + -1) {
    high2 = table[0][(high2 ^ (byte)*_high) & 0xff] ^ high2 >> 8;
    _high = (uint *)((long)_high + 1);
  }
  for (; (buffer)0xb < next; next = next + -0xc) {
    uVar3 = *_high ^ high2;
    uVar1 = _high[1];
    uVar2 = _high[2];
    high2 = table[0xb][uVar3 & 0xff] ^ table[10][uVar3 >> 8 & 0xff] ^ table[9][uVar3 >> 0x10 & 0xff]
            ^ table[8][uVar3 >> 0x18] ^ table[7][uVar1 & 0xff] ^ table[6][uVar1 >> 8 & 0xff] ^
            table[5][uVar1 >> 0x10 & 0xff] ^ table[4][uVar1 >> 0x18] ^ table[3][uVar2 & 0xff] ^
            table[2][uVar2 >> 8 & 0xff] ^ table[1][uVar2 >> 0x10 & 0xff] ^ table[0][uVar2 >> 0x18];
    _high = _high + 3;
  }
  for (; next != (buffer)0x0; next = next + -1) {
    high2 = table[0][(high2 ^ (byte)*_high) & 0xff] ^ high2 >> 8;
    _high = (uint *)((long)_high + 1);
  }
  return high2 ^ 0xffffffff;
}

Assistant:

uint32_t crc32c_append_sw(uint32_t crci, buffer input, size_t length)
{
    buffer next = input;
    uint32_t crc;

    crc = crci ^ 0xffffffff;
    while (length && ((uintptr_t)next & 3) != 0)
    {
        crc = table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
        --length;
    }
    while (length >= 12)
    {
        crc ^= *(uint32_t *)next;
        uint32_t high = *(uint32_t *)(next + 4);
        uint32_t high2 = *(uint32_t *)(next + 8);
        crc = table[11][crc & 0xff]
            ^ table[10][(crc >> 8) & 0xff]
            ^ table[9][(crc >> 16) & 0xff]
            ^ table[8][crc >> 24]
            ^ table[7][high & 0xff]
            ^ table[6][(high >> 8) & 0xff]
            ^ table[5][(high >> 16) & 0xff]
            ^ table[4][high >> 24]
            ^ table[3][high2 & 0xff]
            ^ table[2][(high2 >> 8) & 0xff]
            ^ table[1][(high2 >> 16) & 0xff]
            ^ table[0][high2 >> 24];
        next += 12;
        length -= 12;
    }
    while (length)
    {
        crc = table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
        --length;
    }
    return (uint32_t)crc ^ 0xffffffff;
}